

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O0

void __thiscall
Database_GetEndPastLogicalEOF_Test::TestBody(Database_GetEndPastLogicalEOF_Test *this)

{
  anon_class_24_3_96d47995 fn;
  anon_class_24_3_96d47995 fn_00;
  shared_ptr<pstore::file::in_memory> *file;
  address aVar1;
  uint64_t uVar2;
  size_t size;
  address addr;
  database db;
  Database_GetEndPastLogicalEOF_Test *this_local;
  
  file = in_memory_store::file(&(this->super_Database).store_);
  pstore::database::database<pstore::file::in_memory>((database *)&addr,file,true);
  pstore::database::set_vacuum_mode((database *)&addr,disabled);
  aVar1 = pstore::address::null();
  uVar2 = pstore::database::size((database *)&addr);
  fn.addr.a_ = aVar1.a_;
  fn.db = (database *)&addr;
  fn.size = uVar2 + 1;
  check_for_error<Database_GetEndPastLogicalEOF_Test::TestBody()::__0>(fn,bad_address);
  fn_00.addr.a_ = aVar1.a_;
  fn_00.db = (database *)&addr;
  fn_00.size = uVar2 + 1;
  check_for_error<Database_GetEndPastLogicalEOF_Test::TestBody()::__1>(fn_00,bad_address);
  pstore::database::~database((database *)&addr);
  return;
}

Assistant:

TEST_F (Database, GetEndPastLogicalEOF) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    auto const addr = pstore::address::null ();
    std::size_t size = db.size () + 1;
    check_for_error ([&db, addr, size] () { db.getro (addr, size); },
                     pstore::error_code::bad_address);
    check_for_error ([&db, addr, size] () { db.getrou (addr, size); },
                     pstore::error_code::bad_address);
}